

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall helics::CommonCore::getAddress_abi_cxx11_(CommonCore *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (((this->super_BrokerBase).brokerState._M_i != CONNECTED) ||
     ((this->super_BrokerBase).address._M_string_length == 0)) {
    (*(this->super_BrokerBase)._vptr_BrokerBase[7])(&local_30,&this->super_BrokerBase);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(this->super_BrokerBase).address,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (string *)&(this->super_BrokerBase).address;
}

Assistant:

const std::string& CommonCore::getAddress() const
{
    if ((getBrokerState() != BrokerState::CONNECTED) || (address.empty())) {
        address = generateLocalAddressString();
    }
    return address;
}